

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void pegmatite::defaultErrorReporter(InputRange *ir,string *message)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"error at ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ir->start).line);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ir->finish).col);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void defaultErrorReporter(const InputRange& ir, const std::string& message)
{
	std::cerr
		<< "error at " << ir.start.line << ":" << ir.finish.col
		<< ": " << message << std::endl
		;
}